

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O3

void __thiscall
TPZGeoElRefLess<pzgeom::TPZQuadraticLine>::TPZGeoElRefLess
          (TPZGeoElRefLess<pzgeom::TPZQuadraticLine> *this,void **vtt,TPZGeoMesh *DestMesh,
          TPZGeoElRefLess<pzgeom::TPZQuadraticLine> *cp)

{
  void *pvVar1;
  int64_t iVar2;
  long lVar3;
  
  TPZGeoEl::TPZGeoEl(&this->super_TPZGeoEl,vtt + 1,DestMesh,&cp->super_TPZGeoEl);
  pvVar1 = *vtt;
  *(void **)&this->super_TPZGeoEl = pvVar1;
  *(void **)(&(((TPZGeoElRefLess<pzgeom::TPZQuadraticLine> *)(&this->fGeo + -2))->super_TPZGeoEl).
              field_0x0 + *(long *)((long)pvVar1 + -0x60)) = vtt[3];
  (this->fGeo).super_TPZNodeRep<3,_pztopology::TPZLine>.super_TPZLine.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)&PTR__TPZNodeRep_018b12e0;
  iVar2 = (cp->fGeo).super_TPZNodeRep<3,_pztopology::TPZLine>.fNodeIndexes[1];
  (this->fGeo).super_TPZNodeRep<3,_pztopology::TPZLine>.fNodeIndexes[0] =
       (cp->fGeo).super_TPZNodeRep<3,_pztopology::TPZLine>.fNodeIndexes[0];
  (this->fGeo).super_TPZNodeRep<3,_pztopology::TPZLine>.fNodeIndexes[1] = iVar2;
  (this->fGeo).super_TPZNodeRep<3,_pztopology::TPZLine>.fNodeIndexes[2] =
       (cp->fGeo).super_TPZNodeRep<3,_pztopology::TPZLine>.fNodeIndexes[2];
  (this->fGeo).super_TPZNodeRep<3,_pztopology::TPZLine>.super_TPZLine.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)&PTR__TPZQuadraticLine_018b1258;
  lVar3 = 0;
  do {
    *(undefined ***)((long)&this->fNeighbours[0].super_TPZSavable._vptr_TPZSavable + lVar3) =
         &PTR__TPZGeoElSideIndex_0187bb90;
    *(undefined4 *)((long)&this->fNeighbours[0].fSide + lVar3) = 0xffffffff;
    *(undefined8 *)((long)&this->fNeighbours[0].fGeoElIndex + lVar3) = 0xffffffffffffffff;
    lVar3 = lVar3 + 0x18;
  } while (lVar3 != 0x48);
  lVar3 = 0;
  do {
    *(undefined8 *)((long)&this->fNeighbours[0].fGeoElIndex + lVar3) =
         *(undefined8 *)((long)&cp->fNeighbours[0].fGeoElIndex + lVar3);
    *(undefined4 *)((long)&this->fNeighbours[0].fSide + lVar3) =
         *(undefined4 *)((long)&cp->fNeighbours[0].fSide + lVar3);
    lVar3 = lVar3 + 0x18;
  } while (lVar3 != 0x48);
  return;
}

Assistant:

TPZGeoElRefLess<TGeo>::TPZGeoElRefLess(TPZGeoMesh &DestMesh, const TPZGeoElRefLess &cp):
TPZRegisterClassId(&TPZGeoElRefLess<TGeo>::ClassId),TPZGeoEl(DestMesh, cp), fGeo(cp.fGeo,DestMesh) {
	int i;
	const int n = TGeo::NSides;
	for(i = 0; i < n; i++){
		this->fNeighbours[i] = cp.fNeighbours[i];
	}
}